

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature,cmListFileContext *lfc)

{
  bool bVar1;
  reference pvVar2;
  bool local_21;
  bool ret;
  cmListFileContext *lfc_local;
  cmTarget *pcStack_10;
  TLLSignature signature_local;
  cmTarget *this_local;
  
  local_21 = true;
  lfc_local._4_4_ = signature;
  pcStack_10 = this;
  bVar1 = std::
          vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
          ::empty(&this->TLLCommands);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
             ::back(&this->TLLCommands);
    local_21 = pvVar2->first == lfc_local._4_4_;
  }
  bVar1 = std::
          vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
          ::empty(&this->TLLCommands);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
             ::back(&this->TLLCommands);
    bVar1 = ::operator!=(&pvVar2->second,lfc);
    if (!bVar1) {
      return local_21;
    }
  }
  std::
  vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
  ::emplace_back<cmTarget::TLLSignature&,cmListFileContext_const&>
            ((vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
              *)&this->TLLCommands,(TLLSignature *)((long)&lfc_local + 4),lfc);
  return local_21;
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature,
                                   cmListFileContext const& lfc)
{
  bool ret = true;
  if (!this->TLLCommands.empty()) {
    if (this->TLLCommands.back().first != signature) {
      ret = false;
    }
  }
  if (this->TLLCommands.empty() || this->TLLCommands.back().second != lfc) {
    this->TLLCommands.emplace_back(signature, lfc);
  }
  return ret;
}